

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_public.c
# Opt level: O2

void nng_http_handler_set_data(nng_http_handler *h,void *dat,_func_void_void_ptr *dtor)

{
  nni_http_handler_set_data(h,dat,dtor);
  return;
}

Assistant:

void
nng_http_handler_set_data(nng_http_handler *h, void *dat, void (*dtor)(void *))
{
#ifdef NNG_SUPP_HTTP
	nni_http_handler_set_data(h, dat, dtor);
#else
	NNI_ARG_UNUSED(h);
	NNI_ARG_UNUSED(dat);
	NNI_ARG_UNUSED(dtor);
#endif
}